

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O0

void add_game(Game *game)

{
  Game *in_RDI;
  
  gamesCount = gamesCount + 1;
  games = (Game **)realloc(games,gamesCount * 8);
  games[gamesCount - 1] = in_RDI;
  return;
}

Assistant:

void add_game(Game * game)
{
	gamesCount++;
	// cppcheck-suppress memleakOnRealloc
	games = (Game **)realloc(games, sizeof(Game *)*gamesCount); 
	games[(gamesCount-1)] = game;
}